

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O1

void * utf8ncpy(void *dst,void *src,size_t n)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 1;
  do {
    lVar2 = lVar1;
    *(undefined1 *)((long)dst + lVar2 + -1) = *(undefined1 *)((long)src + lVar2 + -1);
    if (*(char *)((long)src + lVar2) == '\0') goto LAB_00111635;
    n = n - 1;
    lVar1 = lVar2 + 1;
  } while (n != 0);
  n = 0;
LAB_00111635:
  if (n != 0) {
    memset((void *)(lVar2 + (long)dst),0,n);
  }
  return dst;
}

Assistant:

void *utf8ncpy(void *dst, const void *src, size_t n) {
  char *d = (char *)dst;
  const char *s = (const char *)src;

  // overwriting anything previously in dst, write byte-by-byte
  // from src
  do {
    *d++ = *s++;
  } while (('\0' != *s) && (0 != --n));

  // append null terminating byte
  while (0 != n) {
    *d++ = '\0';
    n--;
  }

  return dst;
}